

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O2

void __thiscall cs::statement_for::run_impl(statement_for *this)

{
  context_t *c;
  iterator *this_00;
  bool bVar1;
  instance_type *this_01;
  _Elt_pointer ppsVar2;
  reference ptVar3;
  bool *pbVar4;
  _Elt_pointer ppsVar5;
  element_type *peVar6;
  _Elt_pointer ppsVar7;
  any local_c8;
  slot_type *local_c0;
  scope_guard scope;
  _Map_pointer local_b0;
  scope_guard top_scope;
  slot_type *local_98;
  
  peVar6 = (((this->super_statement_base).context.
             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6->break_block == true) {
    peVar6->break_block = false;
  }
  c = &(this->super_statement_base).context;
  if (peVar6->continue_block == true) {
    peVar6->continue_block = false;
  }
  local_c0 = (slot_type *)this;
  scope_guard::scope_guard(&top_scope,c);
  this_01 = (((((context_t *)&(local_c0->key)._M_string_length)->
              super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->instance).
            super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = &(((deque<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
                *)&(local_c0->value).second)->
             super__Deque_base<cs::tree_type<cs::token_base_*>,_std::allocator<cs::tree_type<cs::token_base_*>_>_>
             )._M_impl.super__Deque_impl_data._M_start;
  ptVar3 = std::
           _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
           ::operator[](this_00,0);
  instance_type::parse_define_var(this_01,ptVar3->mRoot,false,false);
  scope_guard::scope_guard(&scope,c);
  do {
    process_context::poll_event((process_context *)current_process);
    peVar6 = (((c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ptVar3 = std::
             _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
             ::operator[](this_00,1);
    local_98 = (slot_type *)ptVar3->mRoot;
    runtime_type::parse_expr
              ((runtime_type *)&local_c8,(iterator *)peVar6,SUB81(&stack0xffffffffffffff68,0));
    pbVar4 = cs_impl::any::const_val<bool>(&local_c8);
    bVar1 = *pbVar4;
    cs_impl::any::recycle(&local_c8);
    if (bVar1 == false) {
LAB_0015eb05:
      scope_guard::~scope_guard(&scope);
      scope_guard::~scope_guard(&top_scope);
      return;
    }
    ppsVar5 = ((iterator *)((long)local_c0 + 0x80))->_M_cur;
    ppsVar7 = (_Elt_pointer)local_c0[2].value.first._M_dataplus._M_p;
    local_b0 = *(_Map_pointer *)((long)local_c0 + 0x98);
    ppsVar2 = ((iterator *)((long)local_c0 + 0xa0))->_M_cur;
    while (ppsVar5 != ppsVar2) {
      statement_base::run(*ppsVar5);
      peVar6 = (((c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar6->return_fcall != false) goto LAB_0015eb05;
      if (peVar6->break_block == true) {
        peVar6->break_block = false;
        goto LAB_0015eb05;
      }
      if (peVar6->continue_block != false) {
        peVar6->continue_block = false;
        goto LAB_0015eaae;
      }
      ppsVar5 = ppsVar5 + 1;
      if (ppsVar5 == ppsVar7) {
        ppsVar5 = local_b0[1];
        local_b0 = local_b0 + 1;
        ppsVar7 = ppsVar5 + 0x40;
      }
    }
    peVar6 = (((c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_0015eaae:
    ptVar3 = std::
             _Deque_iterator<cs::tree_type<cs::token_base_*>,_cs::tree_type<cs::token_base_*>_&,_cs::tree_type<cs::token_base_*>_*>
             ::operator[](this_00,2);
    local_c8.mDat = (proxy *)ptVar3->mRoot;
    runtime_type::parse_expr
              ((runtime_type *)&stack0xffffffffffffff60,(iterator *)peVar6,SUB81(&local_c8,0));
    cs_impl::any::recycle((any *)&stack0xffffffffffffff60);
    scope_guard::clear(&scope);
  } while( true );
}

Assistant:

void statement_for::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard top_scope(context);
		context->instance->parse_define_var(mParallel[0].root());
		scope_guard scope(context);
		while (true) {
			current_process->poll_event();
			if (!context->instance->parse_expr(mParallel[1].root()).const_val<boolean>())
				break;
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			context->instance->parse_expr(mParallel[2].root());
			scope.clear();
		}
	}